

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  string *ctx;
  App a;
  string local_88;
  App local_68;
  
  ctx = &local_88;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SDL-App","");
  app::App::App(&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  app::App::init(&local_68,(EVP_PKEY_CTX *)ctx);
  app::App::mainLoop(&local_68);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Finished",8);
  app::App::~App(&local_68);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
     app::App a;

     try {
          a.init();
     }

     catch (const error::InitError& e) {
          std::cerr << "Error while initializing App: "
                    << e.what() << std::endl;
          return 1;
     }

     a.mainLoop();

     std::cout << "Finished";

     return 0;
}